

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

char * Json::duplicateAndPrefixStringValue(char *value,uint length)

{
  uint *puVar1;
  undefined8 extraout_RAX;
  ostringstream oss;
  string sStack_1b8;
  string local_198 [11];
  
  if (length < 0x7ffffffb) {
    puVar1 = (uint *)malloc((ulong)(length + 5));
    if (puVar1 != (uint *)0x0) {
      *puVar1 = length;
      memcpy(puVar1 + 1,value,(ulong)length);
      *(char *)((long)puVar1 + (ulong)length + 4) = '\0';
      return (char *)puVar1;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::operator<<((ostream *)local_198,
                    "in Json::Value::duplicateAndPrefixStringValue(): length too big for prefixing")
    ;
    std::__cxx11::stringbuf::str();
    throwLogicError(&sStack_1b8);
  }
  std::__cxx11::string::string
            ((string *)local_198,
             "in Json::Value::duplicateAndPrefixStringValue(): Failed to allocate string value buffer"
             ,(allocator *)&sStack_1b8);
  throwRuntimeError(local_198);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static inline char* duplicateAndPrefixStringValue(
    const char* value,
    unsigned int length)
{
  // Avoid an integer overflow in the call to malloc below by limiting length
  // to a sane value.
  JSON_ASSERT_MESSAGE(length <= (unsigned)Value::maxInt - sizeof(unsigned) - 1U,
                      "in Json::Value::duplicateAndPrefixStringValue(): "
                      "length too big for prefixing");
  unsigned actualLength = length + sizeof(unsigned) + 1U;
  char* newString = static_cast<char*>(malloc(actualLength));
  if (newString == 0) {
    throwRuntimeError(
        "in Json::Value::duplicateAndPrefixStringValue(): "
        "Failed to allocate string value buffer");
  }
  *reinterpret_cast<unsigned*>(newString) = length;
  memcpy(newString + sizeof(unsigned), value, length);
  newString[actualLength - 1U] = 0; // to avoid buffer over-run accidents by users later
  return newString;
}